

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char16_t * openjtalk_getHTSVoiceNameU16(OpenJTalk *oj,HtsVoiceFilelist *list,uint i,char16_t *name)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  char16_t cVar3;
  int iVar4;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (list != (HtsVoiceFilelist *)0x0) {
    iVar4 = i + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        memset(name,0,0x208);
        pcVar1 = (list->field_2).nameU16;
        if (pcVar1 == (char16_t *)0x0 || name == (char16_t *)0x0) {
          return name;
        }
        cVar3 = *pcVar1;
        pcVar2 = name;
        do {
          pcVar1 = pcVar1 + (cVar3 != 0);
          *pcVar2 = cVar3;
          pcVar2 = pcVar2 + 1;
          cVar3 = *pcVar1;
        } while (cVar3 != 0);
        return name;
      }
      list = list->succ;
    } while (list != (HtsVoiceFilelist_tag *)0x0);
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getHTSVoiceNameU16(OpenJTalk *oj, HtsVoiceFilelist *list, unsigned int i, char16_t *name)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (list == NULL)
	{
		return NULL;
	}

	//HtsVoiceFilelist* temp = list;
	unsigned int counter = 0;
	for (HtsVoiceFilelist *temp = list; temp != NULL; temp = temp->succ)
	{
		if (counter++ == i)
		{
			if (temp)
			{
				clear_path_stringU16(name, MAX_PATH);
				strcpyU16(name, temp->nameU16);
				return name;
			}
			else
			{
				return NULL;
			}
		}
	}
	return NULL;
}